

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# can_implicitly_cast.cpp
# Opt level: O1

void duckdb::CanCastImplicitlyFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  ClientContext *context;
  reference pvVar1;
  reference pvVar2;
  CastFunctionSet *this;
  int64_t iVar3;
  Value v;
  Value local_60;
  
  context = ExpressionState::GetContext(state);
  pvVar1 = vector<duckdb::Vector,_true>::operator[](&args->data,0);
  pvVar2 = vector<duckdb::Vector,_true>::operator[](&args->data,1);
  this = CastFunctionSet::Get(context);
  iVar3 = CastFunctionSet::ImplicitCastCost(this,&pvVar1->type,&pvVar2->type);
  Value::BOOLEAN(&local_60,-1 < iVar3);
  Vector::Reference(result,&local_60);
  Value::~Value(&local_60);
  return;
}

Assistant:

static void CanCastImplicitlyFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &context = state.GetContext();
	bool can_cast_implicitly = CanCastImplicitly(context, args.data[0].GetType(), args.data[1].GetType());
	auto v = Value::BOOLEAN(can_cast_implicitly);
	result.Reference(v);
}